

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_feat_digging(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  parser_error pVar3;
  
  pvVar2 = parser_priv(p);
  wVar1 = parser_getint(p,"dig");
  if (pvVar2 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar3 = PARSE_ERROR_OUT_OF_BOUNDS;
    if (0xfffffffa < (uint)(wVar1 + L'\xfffffffa')) {
      *(char *)((long)pvVar2 + 0x22) = (char)wVar1;
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_feat_digging(struct parser *p) {
	struct feature *f = parser_priv(p);
	int dig_idx = parser_getint(p, "dig");

	if (!f)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (dig_idx < DIGGING_RUBBLE + 1 || dig_idx >= DIGGING_MAX + 1) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}
	f->dig = dig_idx;
	return PARSE_ERROR_NONE;
}